

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall cimg_library::CImgDisplay::_paint(CImgDisplay *this,bool wait_expose)

{
  X11_info *pXVar1;
  GC gc;
  XEvent event;
  Display *dpy;
  CImgDisplay *pCStack_10;
  bool wait_expose_local;
  CImgDisplay *this_local;
  
  if (((this->_is_closed & 1U) == 0) && (this->_image != (XImage *)0x0)) {
    dpy._7_1_ = wait_expose;
    pCStack_10 = this;
    pXVar1 = cimg::X11_attr();
    event.xerror.resourceid = (XID)pXVar1->display;
    event.pad[0x17] = event.xerror.resourceid;
    if ((dpy._7_1_ & 1) == 0) {
      XPutImage(event.xerror.resourceid,this->_window,
                *(undefined8 *)
                 (*(long *)(event.xerror.resourceid + 0xe8) +
                  (long)*(int *)(event.xerror.resourceid + 0xe0) * 0x80 + 0x48),this->_image,0,0,0,0
                ,this->_width,this->_height);
    }
    else {
      gc._0_4_ = 0xc;
      event.pad[0] = 0;
      event.xany.serial._0_4_ = 1;
      event.xany.display = (Display *)this->_window;
      event.xgeneric.extension = 0;
      event.xgeneric.evtype = 0;
      event.xfocus.mode = width(this);
      event.xfocus.detail = height(this);
      event.xexpose.width = 0;
      XSendEvent(event.pad[0x17],this->_window,0,0,&gc);
    }
  }
  return;
}

Assistant:

void _paint(const bool wait_expose=true) {
      if (_is_closed || !_image) return;
      Display *const dpy = cimg::X11_attr().display;
      if (wait_expose) { // Send an expose event sticked to display window to force repaint.
        XEvent event;
        event.xexpose.type = Expose;
        event.xexpose.serial = 0;
        event.xexpose.send_event = 1;
        event.xexpose.display = dpy;
        event.xexpose.window = _window;
        event.xexpose.x = 0;
        event.xexpose.y = 0;
        event.xexpose.width = width();
        event.xexpose.height = height();
        event.xexpose.count = 0;
        XSendEvent(dpy,_window,0,0,&event);
      } else { // Repaint directly (may be called from the expose event).
        GC gc = DefaultGC(dpy,DefaultScreen(dpy));
#ifdef cimg_use_xshm
        if (_shminfo) XShmPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height,1);
        else XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#else
        XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#endif
      }
    }